

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test.cpp
# Opt level: O3

bool Test::run_tests(void)

{
  undefined8 *puVar1;
  _List_node_base *__s;
  byte bVar2;
  size_t sVar3;
  undefined8 uVar4;
  Registry *pRVar5;
  ostream *poVar6;
  long *plVar7;
  bool bVar8;
  _List_node_base *p_Var9;
  char *pcVar10;
  char local_39;
  Registry *local_38;
  
  local_38 = Registry::getInstance();
  pRVar5 = (Registry *)
           (local_38->tests).super__List_base<Test_*,_std::allocator<Test_*>_>._M_impl._M_node.
           super__List_node_base._M_next;
  bVar8 = true;
  if (pRVar5 != local_38) {
    do {
      puVar1 = (undefined8 *)
               (pRVar5->tests).super__List_base<Test_*,_std::allocator<Test_*>_>._M_impl._M_node.
               _M_size;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Testing: ",9);
      pcVar10 = (char *)*puVar1;
      if (pcVar10 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x112118);
      }
      else {
        sVar3 = strlen(pcVar10);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar10,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"... ",4);
      std::ostream::flush();
      if (puVar1[3] == 0) {
        uVar4 = std::__throw_bad_function_call();
        __cxa_end_catch();
        _Unwind_Resume(uVar4);
      }
      bVar2 = (*(code *)puVar1[4])(puVar1 + 1);
      pcVar10 = "FAILED!";
      if (bVar2 != 0) {
        pcVar10 = "Ok.";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,pcVar10,(ulong)(bVar2 ^ 1) * 4 + 3);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
      std::ostream::put('\x18');
      std::ostream::flush();
      bVar8 = (bool)(bVar8 & bVar2);
      pRVar5 = (Registry *)
               (pRVar5->tests).super__List_base<Test_*,_std::allocator<Test_*>_>._M_impl._M_node.
               super__List_node_base._M_next;
    } while (pRVar5 != local_38);
  }
  pRVar5 = Registry::getInstance();
  if ((pRVar5->marks).
      super__List_base<std::pair<const_char_*,_int>,_std::allocator<std::pair<const_char_*,_int>_>_>
      ._M_impl._M_node._M_size != 0) {
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
    std::ostream::put('\x18');
    poVar6 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Marked lines:",0xd);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    pRVar5 = Registry::getInstance();
    p_Var9 = (pRVar5->marks).
             super__List_base<std::pair<const_char_*,_int>,_std::allocator<std::pair<const_char_*,_int>_>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    if (p_Var9 != (_List_node_base *)&pRVar5->marks) {
      do {
        __s = p_Var9[1]._M_next;
        if (__s == (_List_node_base *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x112118);
        }
        else {
          sVar3 = strlen((char *)__s);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,(char *)__s,sVar3);
        }
        local_39 = ':';
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,&local_39,1);
        plVar7 = (long *)std::ostream::operator<<((ostream *)poVar6,*(int *)&p_Var9[1]._M_prev);
        std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
        std::ostream::put((char)plVar7);
        std::ostream::flush();
        p_Var9 = p_Var9->_M_next;
      } while (p_Var9 != (_List_node_base *)&pRVar5->marks);
    }
  }
  return bVar8;
}

Assistant:

bool Test::run_tests()
{
	using namespace std;

	bool success = true;
	for (Test *test : Registry::getInstance().tests)
	{
		cout << "Testing: " << test->description << "... " << flush;
		bool ret = false;
		try
		{
			ret = test->body();
			cout << (ret ? "Ok." : "FAILED!") << endl;
		}
		catch (std::exception &e)
			{ cout << "FAILED!" << endl << '\t' << e.what() << endl; }
		catch (...)
			{ cout << "FAILED!\n\tAn undetermined exception occurred!" << endl; }
		success &= ret;
	}

	if (Registry::getInstance().marks.size() > 0)
	{
		cout << endl << "Marked lines:" << endl;
		for (Registry::Mark &mark : Registry::getInstance().marks)
			cout << mark.first << ':' << mark.second << endl;
	}

	return success;
}